

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createRvalueSwizzle
          (Builder *this,Decoration precision,Id typeId,Id source,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *channels)

{
  int iVar1;
  bool bVar2;
  Id IVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  Instruction *pIVar7;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_68;
  int local_5c;
  Instruction *pIStack_58;
  int i;
  Instruction *swizzle;
  undefined1 local_48 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> operands;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *channels_local;
  Id source_local;
  Id typeId_local;
  Decoration precision_local;
  Builder *this_local;
  
  operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)channels;
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(channels);
  if (sVar4 == 1) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    IVar3 = createCompositeExtract(this,source,typeId,*pvVar5);
    this_local._4_4_ = setPrecision(this,IVar3,precision);
  }
  else if ((this->generatingOpCodeForSpecConst & 1U) == 0) {
    pIVar7 = (Instruction *)::operator_new(0x60);
    IVar3 = getUniqueId(this);
    spv::Instruction::Instruction(pIVar7,IVar3,typeId,OpVectorShuffle);
    pIStack_58 = pIVar7;
    bVar2 = isVector(this,source);
    pIVar7 = pIStack_58;
    if (!bVar2) {
      __assert_fail("isVector(source)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0xbaf,
                    "Id spv::Builder::createRvalueSwizzle(Decoration, Id, Id, const std::vector<unsigned int> &)"
                   );
    }
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    spv::Instruction::reserveOperands(pIVar7,sVar4 + 2);
    spv::Instruction::addIdOperand(pIStack_58,source);
    spv::Instruction::addIdOperand(pIStack_58,source);
    local_5c = 0;
    while( true ) {
      iVar1 = local_5c;
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
      pIVar7 = pIStack_58;
      if ((int)sVar4 <= iVar1) break;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_5c);
      spv::Instruction::addImmediateOperand(pIVar7,*pvVar5);
      local_5c = local_5c + 1;
    }
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_68,
               pIStack_58);
    addInstruction(this,&local_68);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_68);
    IVar3 = spv::Instruction::getResultId(pIStack_58);
    this_local._4_4_ = setPrecision(this,IVar3,precision);
  }
  else {
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&swizzle + 7));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,2,
               (allocator_type *)((long)&swizzle + 7));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&swizzle + 7));
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,1);
    *pvVar6 = source;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,0);
    *pvVar6 = source;
    IVar3 = createSpecConstantOp
                      (this,OpVectorShuffle,typeId,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    this_local._4_4_ = setPrecision(this,IVar3,precision);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  }
  return this_local._4_4_;
}

Assistant:

Id Builder::createRvalueSwizzle(Decoration precision, Id typeId, Id source, const std::vector<unsigned>& channels)
{
    if (channels.size() == 1)
        return setPrecision(createCompositeExtract(source, typeId, channels.front()), precision);

    if (generatingOpCodeForSpecConst) {
        std::vector<Id> operands(2);
        operands[0] = operands[1] = source;
        return setPrecision(createSpecConstantOp(OpVectorShuffle, typeId, operands, channels), precision);
    }
    Instruction* swizzle = new Instruction(getUniqueId(), typeId, OpVectorShuffle);
    assert(isVector(source));
    swizzle->reserveOperands(channels.size() + 2);
    swizzle->addIdOperand(source);
    swizzle->addIdOperand(source);
    for (int i = 0; i < (int)channels.size(); ++i)
        swizzle->addImmediateOperand(channels[i]);
    addInstruction(std::unique_ptr<Instruction>(swizzle));

    return setPrecision(swizzle->getResultId(), precision);
}